

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O2

bool Refal2::CInternalProgramBuilder::Check(CModuleDataVector *modules,CErrorsHelper *errors)

{
  bool bVar1;
  CInternalProgramBuilder builder;
  CInternalProgramBuilder CStack_78;
  
  bVar1 = CErrorsHelper::HasErrors(errors);
  if ((bVar1) ||
     ((modules->
      super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (modules->
      super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    bVar1 = false;
  }
  else {
    CInternalProgramBuilder(&CStack_78,errors);
    collect(&CStack_78,modules);
    bVar1 = CErrorsHelper::HasErrors(errors);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      check(&CStack_78);
      bVar1 = CErrorsHelper::HasErrors(errors);
      bVar1 = !bVar1;
    }
    ~CInternalProgramBuilder(&CStack_78);
  }
  std::
  vector<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
  ::clear(modules);
  return bVar1;
}

Assistant:

bool CInternalProgramBuilder::Check( CModuleDataVector& modules,
	CErrorsHelper& errors )
{
	bool result = false;
	if( !errors.HasErrors() && !modules.empty() ) {
		CInternalProgramBuilder builder( errors );
		builder.collect( modules );
		if( !errors.HasErrors() ) {
			builder.check();
			result = !errors.HasErrors();
		}
	}
	modules.clear();
	return result;
}